

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyDepthTest
          (UncommittedRegionsAccessTestCase *this,Functions *gl,ShaderProgram *program,GLint width,
          GLint height,GLint widthCommitted)

{
  pointer puVar1;
  uint uVar2;
  UncommittedRegionsAccessTestCase *pUVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int x;
  bool bVar7;
  long *plVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dataDepth;
  VertexArrayBinding vertexArrays [2];
  pointer local_158;
  pointer puStack_150;
  pointer local_148;
  long local_140 [2];
  int local_130;
  uint local_124;
  long *local_120;
  long local_118;
  long local_110 [2];
  long *local_100;
  long local_f8;
  long local_f0 [2];
  UncommittedRegionsAccessTestCase *local_e0;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  char local_c0 [16];
  int local_b0;
  VertexComponentType local_a8;
  VertexComponentConversion VStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  undefined1 *local_90;
  PrimitiveType local_88;
  long *local_80 [2];
  long local_70 [2];
  undefined4 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined1 *local_40;
  
  local_100 = local_f0;
  local_124 = height;
  local_e0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"vertex","");
  local_158 = (pointer)CONCAT44(local_158._4_4_,PRIMITIVETYPE_TRIANGLE_STRIP);
  puStack_150 = (pointer)local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_150,local_100,local_f8 + (long)local_100);
  local_130 = 0;
  local_d8._0_4_ = (Type)local_158;
  local_d0._M_p = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,puStack_150,(long)local_148 + (long)puStack_150);
  local_b0 = local_130;
  local_a8 = VTX_COMP_FLOAT;
  VStack_a4 = VTX_COMP_CONVERT_NONE;
  iStack_a0 = 3;
  iStack_9c = 4;
  local_98 = 0;
  local_90 = gl4cts::vertices;
  if (puStack_150 != (pointer)local_140) {
    operator_delete(puStack_150,local_140[0] + 1);
  }
  local_120 = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"inTexCoord","");
  local_158 = (pointer)CONCAT44(local_158._4_4_,PRIMITIVETYPE_TRIANGLE_STRIP);
  puStack_150 = (pointer)local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_150,local_120,local_118 + (long)local_120);
  local_130 = 0;
  local_88 = (Type)local_158;
  plVar8 = local_70;
  local_80[0] = plVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,puStack_150,(long)local_148 + (long)puStack_150);
  local_60 = local_130;
  local_58 = 8;
  uStack_50 = 0x400000002;
  local_48 = 0;
  local_40 = gl4cts::texCoord;
  if (puStack_150 != (pointer)local_140) {
    operator_delete(puStack_150,local_140[0] + 1);
  }
  pUVar3 = local_e0;
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &(pUVar3->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase
              .field_0x88,"Perform Depth Test - ",0x15);
  (*gl->clear)(0x4500);
  (*gl->enable)(0xb71);
  (*gl->depthFunc)(0x201);
  local_158 = (pointer)&DAT_600000001;
  puStack_150 = (pointer)CONCAT44(puStack_150._4_4_,INDEXTYPE_UINT32);
  local_148 = (pointer)gl4cts::indices;
  glu::draw(((pUVar3->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             super_TestCase.m_context)->m_renderCtx,(program->m_program).m_program,2,
            (VertexArrayBinding *)local_d8,(PrimitiveList *)&local_158,(DrawUtilCallback *)0x0);
  uVar2 = local_124;
  local_158 = (pointer)0x0;
  puStack_150 = (pointer)0x0;
  local_148 = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158,
             (long)(int)(local_124 * width));
  puVar1 = local_158;
  (*gl->readPixels)(0,0,width,uVar2,0x1902,0x1405,local_158);
  bVar7 = width <= widthCommitted;
  if (widthCommitted < width) {
    do {
      uVar4 = (ulong)uVar2;
      iVar5 = widthCommitted;
      if (0 < (int)uVar2) {
        do {
          if (puVar1[iVar5] != 0xffffffff) {
            (*gl->disable)(0xb71);
            if (bVar7 == false) goto LAB_00a758fc;
            goto LAB_00a758f1;
          }
          iVar5 = iVar5 + width;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      widthCommitted = widthCommitted + 1;
      bVar7 = width <= widthCommitted;
    } while (widthCommitted != width);
  }
LAB_00a758f1:
  (*gl->disable)(0xb71);
LAB_00a758fc:
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  lVar6 = -0xa0;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -10;
    lVar6 = lVar6 + 0x50;
  } while (lVar6 != 0);
  return bVar7;
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyDepthTest(const Functions& gl, ShaderProgram& program, GLint width,
													   GLint height, GLint widthCommitted)
{
	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("vertex", 3, 4, 0, vertices),
											   glu::va::Float("inTexCoord", 2, 4, 0, texCoord) };

	mLog << "Perform Depth Test - ";

	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_LESS);

	glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(indices), indices));

	std::vector<GLuint> dataDepth;
	dataDepth.resize(width * height);
	GLuint* dataDepthPtr = dataDepth.data();

	gl.readPixels(0, 0, width, height, GL_DEPTH_COMPONENT, GL_UNSIGNED_INT, (GLvoid*)dataDepthPtr);
	for (int x = widthCommitted; x < width; ++x)
		for (int y = 0; y < height; ++y)
		{
			if (dataDepthPtr[x + y * width] != 0xFFFFFFFF)
			{
				gl.disable(GL_DEPTH_TEST);
				return false;
			}
		}

	gl.disable(GL_DEPTH_TEST);
	return true;
}